

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

work_t __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getBoundsInv
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,long i,long k,int j)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  work_t ret;
  uint local_20;
  
  local_20 = PixelTraits<unsigned_short>::invalid();
  if ((((-1 < in_ECX) && (in_ECX < *in_RDI)) && (-1 < in_RSI)) &&
     (((in_RSI < *(long *)(in_RDI + 2) && (-1 < in_RDX)) && (in_RDX < *(long *)(in_RDI + 4))))) {
    local_20 = (uint)*(ushort *)
                      (*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)in_ECX * 8) + in_RDX * 8)
                      + in_RSI * 2);
  }
  return local_20;
}

Assistant:

work_t getBoundsInv(long i, long k, int j=0) const
    {
      work_t ret=ptraits::invalid();

      if (j >= 0 && j < depth && i >= 0 && i < width && k >= 0 && k < height)
      {
        ret=static_cast<work_t>(img[j][k][i]);
      }

      return ret;
    }